

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_enc.c
# Opt level: O0

int rsa_init(void *vprsactx,void *vrsa,OSSL_PARAM *params,int operation)

{
  int iVar1;
  int in_ECX;
  char *in_RDX;
  OSSL_LIB_CTX *in_RSI;
  RSA *in_RDI;
  PROV_RSA_CTX *prsactx;
  OSSL_PARAM *in_stack_00000140;
  void *in_stack_00000148;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = ossl_prov_is_running();
  if (((iVar1 == 0) || (in_RDI == (RSA *)0x0)) || (in_RSI == (OSSL_LIB_CTX *)0x0)) {
    local_4 = 0;
  }
  else {
    iVar1 = ossl_rsa_check_key((OSSL_LIB_CTX *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_RDI,
                               in_stack_ffffffffffffffcc);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = RSA_up_ref((RSA *)in_RSI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        RSA_free((RSA *)in_RDI->libctx);
        in_RDI->libctx = in_RSI;
        *(int *)&in_RDI->field_0x14 = in_ECX;
        iVar1 = RSA_test_flags((RSA *)in_RDI->libctx,0xf000);
        if (iVar1 == 0) {
          in_RDI->version = 1;
          local_4 = rsa_set_ctx_params(in_stack_00000148,in_stack_00000140);
        }
        else {
          ERR_new();
          ERR_set_debug(in_RDX,in_ECX,(char *)in_RDI);
          ERR_set_error(0x39,0xc0103,(char *)0x0);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int rsa_init(void *vprsactx, void *vrsa, const OSSL_PARAM params[],
                    int operation)
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;

    if (!ossl_prov_is_running() || prsactx == NULL || vrsa == NULL)
        return 0;

    if (!ossl_rsa_check_key(prsactx->libctx, vrsa, operation))
        return 0;

    if (!RSA_up_ref(vrsa))
        return 0;
    RSA_free(prsactx->rsa);
    prsactx->rsa = vrsa;
    prsactx->operation = operation;

    switch (RSA_test_flags(prsactx->rsa, RSA_FLAG_TYPE_MASK)) {
    case RSA_FLAG_TYPE_RSA:
        prsactx->pad_mode = RSA_PKCS1_PADDING;
        break;
    default:
        /* This should not happen due to the check above */
        ERR_raise(ERR_LIB_PROV, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    return rsa_set_ctx_params(prsactx, params);
}